

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::Swap
          (CodeGeneratorResponse *this,CodeGeneratorResponse *other)

{
  CodeGeneratorResponse *other_local;
  CodeGeneratorResponse *this_local;
  
  if (other != this) {
    std::swap<std::__cxx11::string*>(&this->error_,&other->error_);
    RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::Swap
              (&this->file_,&other->file_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void CodeGeneratorResponse::Swap(CodeGeneratorResponse* other) {
  if (other != this) {
    std::swap(error_, other->error_);
    file_.Swap(&other->file_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}